

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

void duckdb::ColumnDataCopy<duckdb::hugeint_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  byte bVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  hugeint_t *source_data_2;
  reference pvVar7;
  ColumnDataAllocator *this_01;
  data_ptr_t pdVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  ushort uVar12;
  idx_t iVar13;
  long lVar14;
  idx_t iVar15;
  hugeint_t *result_data;
  long lVar16;
  VectorDataIndex prev_index;
  _Head_base<0UL,_unsigned_long_*,_false> __s;
  idx_t local_c0;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_70;
  unsigned_long local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  long local_48;
  ulong local_40;
  unsigned_long local_38;
  
  if (copy_count != 0) {
    this = meta_data->segment;
    state = meta_data->state;
    prev_index.index = (meta_data->vector_data_index).index;
    local_c0 = offset;
    do {
      pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,prev_index.index)
      ;
      uVar9 = (ulong)(0x800 - pvVar7->count);
      uVar11 = copy_count;
      if (uVar9 < copy_count) {
        uVar11 = uVar9;
      }
      local_40 = copy_count;
      this_01 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      pdVar8 = ColumnDataAllocator::GetDataPointer
                         (this_01,&state->current_chunk_state,pvVar7->block_id,pvVar7->offset);
      __s._M_head_impl = (unsigned_long *)(pdVar8 + 0x8000);
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60 = 0x800;
      uVar12 = pvVar7->count;
      if (uVar12 == 0) {
        switchD_01043a80::default(__s._M_head_impl,0xff,0x100);
      }
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar9 != 0) {
          pdVar3 = source_data->data;
          psVar1 = source_data->sel->sel_vector;
          lVar14 = 0;
          iVar13 = local_c0;
          do {
            iVar15 = iVar13;
            if (psVar1 != (sel_t *)0x0) {
              iVar15 = (idx_t)psVar1[iVar13];
            }
            uVar5 = *(undefined8 *)(pdVar3 + iVar15 * 0x10 + 8);
            *(undefined8 *)(pdVar8 + lVar14 + (ulong)uVar12 * 0x10) =
                 *(undefined8 *)(pdVar3 + iVar15 * 0x10);
            *(undefined8 *)(pdVar8 + lVar14 + (ulong)uVar12 * 0x10 + 8) = uVar5;
            lVar14 = lVar14 + 0x10;
            iVar13 = iVar13 + 1;
          } while ((uVar11 + (uVar11 == 0)) * 0x10 != lVar14);
        }
      }
      else if (uVar9 != 0) {
        lVar14 = local_c0 * 4;
        lVar16 = 0;
        local_48 = lVar14;
        do {
          psVar1 = source_data->sel->sel_vector;
          if (psVar1 == (sel_t *)0x0) {
            uVar9 = local_c0 + lVar16;
          }
          else {
            uVar9 = (ulong)*(uint *)((long)psVar1 + lVar16 * 4 + lVar14);
          }
          puVar2 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar12 = pvVar7->count;
LAB_00d8f6cb:
            uVar5 = *(undefined8 *)(source_data->data + uVar9 * 0x10 + 8);
            *(undefined8 *)(pdVar8 + (ulong)uVar12 * 0x10) =
                 *(undefined8 *)(source_data->data + uVar9 * 0x10);
            *(undefined8 *)(pdVar8 + (ulong)uVar12 * 0x10 + 8) = uVar5;
          }
          else {
            uVar12 = pvVar7->count;
            if ((puVar2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00d8f6cb;
            if (__s._M_head_impl == (unsigned_long *)0x0) {
              local_38 = local_60;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_38);
              p_Var6 = p_Stack_50;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_58;
              this_00._M_pi =
                   local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var6;
              if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
                 p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&local_70);
              __s._M_head_impl =
                   (pTVar10->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar14 = local_48;
            }
            bVar4 = (byte)((ulong)uVar12 + lVar16) & 0x3f;
            __s._M_head_impl[(ulong)uVar12 + lVar16 >> 6] =
                 __s._M_head_impl[(ulong)uVar12 + lVar16 >> 6] &
                 (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          }
          lVar16 = lVar16 + 1;
          pdVar8 = pdVar8 + 0x10;
        } while (uVar11 + (uVar11 == 0) != lVar16);
        uVar12 = pvVar7->count;
      }
      pvVar7->count = uVar12 + (short)uVar11;
      copy_count = local_40 - uVar11;
      if (copy_count != 0) {
        if ((pvVar7->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index
                    );
        }
        pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[]
                           (&this->vector_data,prev_index.index);
        prev_index.index = (pvVar7->next_data).index;
      }
      if (local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_c0 = local_c0 + uVar11;
    } while (copy_count != 0);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}